

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int eval_expr_select(lyxp_expr *exp,uint16_t *exp_idx,lyxp_expr_type etype,lyd_node *cur_node,
                    lys_module *param_5,lyxp_set *set,int options)

{
  uint uVar1;
  lyxp_expr_type *plVar2;
  undefined8 uVar3;
  uint16_t *puVar4;
  lys_module *plVar5;
  int iVar6;
  int iVar7;
  lys_node *plVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  lyxp_set_node *__s;
  ulong uVar12;
  lyd_node *plVar13;
  char *pcVar14;
  lyxp_set *plVar15;
  long lVar16;
  uint16_t *puVar17;
  ly_ctx *plVar18;
  uint16_t uVar19;
  lyxp_expr *plVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ulong uVar24;
  undefined1 auStack_f8 [8];
  lyxp_node_type root_type;
  anon_union_16_6_eb7c38b1_for_val local_e8;
  undefined8 local_d8;
  hash_table *phStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  char *local_b0;
  lyxp_set local_a8;
  char *local_60;
  uint16_t *local_58;
  lyxp_set *local_50;
  lyxp_expr *local_48;
  lys_module *local_40;
  lyd_node *local_38;
  
  uVar24 = (ulong)*exp_idx;
  plVar2 = exp->repeat[uVar24];
  local_58 = exp_idx;
  local_50 = set;
  local_48 = exp;
  local_40 = param_5;
  local_38 = cur_node;
  if (plVar2 != (lyxp_expr_type *)0x0) {
    uVar23 = 0xffff;
    do {
      uVar23 = uVar23 + 1;
    } while (etype < plVar2[uVar23]);
    if (uVar23 != 0) {
      uVar21 = 0;
      do {
        uVar22 = uVar21;
        if (plVar2[(ushort)(uVar23 - uVar21) - 1] != plVar2[uVar23 - 1]) break;
        uVar21 = uVar21 + 1;
        uVar22 = uVar23;
      } while (uVar23 != uVar21);
      switch(plVar2[uVar23 - 1]) {
      case LYXP_EXPR_NONE:
        goto switchD_0017376e_caseD_0;
      case LYXP_EXPR_OR:
        if (uVar22 == 0) {
          __assert_fail("repeat",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x206c,
                        "int eval_or_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        uStack_c0 = 0;
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        phStack_d0 = (hash_table *)0x0;
        local_e8.nodes = (lyxp_set_node *)0x0;
        local_e8._8_8_ = 0;
        auStack_f8 = (undefined1  [8])0x0;
        _root_type = 0;
        local_a8.type = LYXP_SET_EMPTY;
        local_a8._4_4_ = 0;
        local_a8._8_8_ = 0;
        local_a8.val.nodes = (lyxp_set_node *)0x0;
        local_a8.val._8_8_ = 0;
        local_a8.used = 0;
        local_a8.size = 0;
        local_a8.ht = (hash_table *)0x0;
        local_a8.ctx_pos = 0;
        local_a8.ctx_size = 0;
        local_a8._56_8_ = 0;
        set_fill_set((lyxp_set *)auStack_f8,set);
        plVar20 = local_48;
        iVar6 = eval_expr_select(local_48,local_58,LYXP_EXPR_OR,local_38,param_5,set,options);
        plVar13 = local_38;
        if (iVar6 == 0) {
          if (set != (lyxp_set *)0x0) {
            if ((options & 0x1cU) == 0) {
              lyxp_set_cast(set,LYXP_SET_BOOLEAN,local_38,param_5,options);
              set = local_50;
              plVar20 = local_48;
            }
            else {
              uVar1 = set->used;
              if ((ulong)uVar1 != 0) {
                lVar16 = 0;
                do {
                  if (*(int *)((long)&((set->val).nodes)->pos + lVar16) == 1) {
                    *(undefined4 *)((long)&((set->val).nodes)->pos + lVar16) = 0;
                  }
                  lVar16 = lVar16 + 0x10;
                } while ((ulong)uVar1 << 4 != lVar16);
              }
            }
          }
          uVar23 = 0;
          do {
            if (plVar20->tokens[*local_58] != LYXP_TOKEN_OPERATOR_LOG) {
              __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_LOG",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                            ,0x2081,
                            "int eval_or_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                           );
            }
            if (set == (lyxp_set *)0x0) {
              ly_log_dbg(8,"%-27s %s %s[%u]","eval_or_expr","skipped","Operator(Logic)");
              *local_58 = *local_58 + 1;
LAB_00174f02:
              iVar6 = eval_expr_select(plVar20,local_58,LYXP_EXPR_OR,local_38,param_5,
                                       (lyxp_set *)0x0,options);
              plVar13 = local_38;
              if (iVar6 != 0) goto LAB_00174f7a;
            }
            else {
              pcVar9 = "skipped";
              if ((set->val).bool == 0) {
                pcVar9 = "parsed";
              }
              ly_log_dbg(8,"%-27s %s %s[%u]","eval_or_expr",pcVar9,"Operator(Logic)");
              param_5 = local_40;
              puVar17 = local_58;
              *local_58 = *local_58 + 1;
              if ((set->type == LYXP_SET_BOOLEAN) && ((local_50->val).bool != 0)) goto LAB_00174f02;
              set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
              iVar6 = eval_expr_select(plVar20,puVar17,LYXP_EXPR_OR,local_38,param_5,&local_a8,
                                       options);
              plVar15 = local_50;
              plVar13 = local_38;
              if (iVar6 != 0) goto LAB_00174f7a;
              if (local_50->type == LYXP_SET_SNODE_SET) {
                if ((local_a8._32_8_ & 0xffffffff) != 0) {
                  lVar16 = 0;
                  do {
                    if (*(int *)((long)&(local_a8.val.nodes)->pos + lVar16) == 1) {
                      *(undefined4 *)((long)&(local_a8.val.nodes)->pos + lVar16) = 0;
                    }
                    lVar16 = lVar16 + 0x10;
                  } while ((local_a8._32_8_ & 0xffffffff) << 4 != lVar16);
                }
                set_snode_merge(local_50,&local_a8);
              }
              else {
                lyxp_set_cast(&local_a8,LYXP_SET_BOOLEAN,local_38,param_5,options);
                set_fill_set(plVar15,&local_a8);
              }
            }
            uVar23 = uVar23 + 1;
            set = local_50;
            plVar20 = local_48;
          } while (uVar23 != uVar22);
LAB_00174f6a:
          iVar6 = 0;
          plVar13 = local_38;
        }
        break;
      case LYXP_EXPR_AND:
        if (uVar22 == 0) {
          __assert_fail("repeat",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x201e,
                        "int eval_and_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        uStack_c0 = 0;
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        phStack_d0 = (hash_table *)0x0;
        local_e8.nodes = (lyxp_set_node *)0x0;
        local_e8._8_8_ = 0;
        auStack_f8 = (undefined1  [8])0x0;
        _root_type = 0;
        local_a8.type = LYXP_SET_EMPTY;
        local_a8._4_4_ = 0;
        local_a8._8_8_ = 0;
        local_a8.val.nodes = (lyxp_set_node *)0x0;
        local_a8.val._8_8_ = 0;
        local_a8.used = 0;
        local_a8.size = 0;
        local_a8.ht = (hash_table *)0x0;
        local_a8.ctx_pos = 0;
        local_a8.ctx_size = 0;
        local_a8._56_8_ = 0;
        set_fill_set((lyxp_set *)auStack_f8,set);
        plVar20 = local_48;
        iVar6 = eval_expr_select(local_48,local_58,LYXP_EXPR_AND,local_38,param_5,set,options);
        plVar13 = local_38;
        if (iVar6 == 0) {
          if (set != (lyxp_set *)0x0) {
            if ((options & 0x1cU) == 0) {
              lyxp_set_cast(set,LYXP_SET_BOOLEAN,local_38,param_5,options);
              set = local_50;
              plVar20 = local_48;
            }
            else {
              uVar1 = set->used;
              if ((ulong)uVar1 != 0) {
                lVar16 = 0;
                do {
                  if (*(int *)((long)&((set->val).nodes)->pos + lVar16) == 1) {
                    *(undefined4 *)((long)&((set->val).nodes)->pos + lVar16) = 0;
                  }
                  lVar16 = lVar16 + 0x10;
                } while ((ulong)uVar1 << 4 != lVar16);
              }
            }
          }
          uVar23 = 0;
          do {
            if (plVar20->tokens[*local_58] != LYXP_TOKEN_OPERATOR_LOG) {
              __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_LOG",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                            ,0x2033,
                            "int eval_and_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                           );
            }
            if (set == (lyxp_set *)0x0) {
              ly_log_dbg(8,"%-27s %s %s[%u]","eval_and_expr","skipped","Operator(Logic)");
              *local_58 = *local_58 + 1;
LAB_00174d30:
              iVar6 = eval_expr_select(plVar20,local_58,LYXP_EXPR_AND,local_38,param_5,
                                       (lyxp_set *)0x0,options);
              plVar13 = local_38;
              if (iVar6 != 0) goto LAB_00174f7a;
            }
            else {
              pcVar9 = "parsed";
              if ((set->val).bool == 0) {
                pcVar9 = "skipped";
              }
              ly_log_dbg(8,"%-27s %s %s[%u]","eval_and_expr",pcVar9,"Operator(Logic)");
              param_5 = local_40;
              puVar17 = local_58;
              *local_58 = *local_58 + 1;
              if ((set->type == LYXP_SET_BOOLEAN) && ((local_50->val).bool == 0)) goto LAB_00174d30;
              set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
              iVar6 = eval_expr_select(plVar20,puVar17,LYXP_EXPR_AND,local_38,param_5,&local_a8,
                                       options);
              plVar15 = local_50;
              plVar13 = local_38;
              if (iVar6 != 0) goto LAB_00174f7a;
              if (local_50->type == LYXP_SET_SNODE_SET) {
                if ((local_a8._32_8_ & 0xffffffff) != 0) {
                  lVar16 = 0;
                  do {
                    if (*(int *)((long)&(local_a8.val.nodes)->pos + lVar16) == 1) {
                      *(undefined4 *)((long)&(local_a8.val.nodes)->pos + lVar16) = 0;
                    }
                    lVar16 = lVar16 + 0x10;
                  } while ((local_a8._32_8_ & 0xffffffff) << 4 != lVar16);
                }
                set_snode_merge(local_50,&local_a8);
              }
              else {
                lyxp_set_cast(&local_a8,LYXP_SET_BOOLEAN,local_38,param_5,options);
                set_fill_set(plVar15,&local_a8);
              }
            }
            uVar23 = uVar23 + 1;
            set = local_50;
            plVar20 = local_48;
          } while (uVar23 != uVar22);
          goto LAB_00174f6a;
        }
        break;
      case LYXP_EXPR_EQUALITY:
        if (uVar22 == 0) {
          __assert_fail("repeat",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1fc0,
                        "int eval_equality_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        uStack_c0 = 0;
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        phStack_d0 = (hash_table *)0x0;
        local_e8.nodes = (lyxp_set_node *)0x0;
        local_e8._8_8_ = 0;
        auStack_f8 = (undefined1  [8])0x0;
        _root_type = 0;
        local_a8.type = LYXP_SET_EMPTY;
        local_a8._4_4_ = 0;
        local_a8._8_8_ = 0;
        local_a8.val.nodes = (lyxp_set_node *)0x0;
        local_a8.val._8_8_ = 0;
        local_a8.used = 0;
        local_a8.size = 0;
        local_a8.ht = (hash_table *)0x0;
        local_a8.ctx_pos = 0;
        local_a8.ctx_size = 0;
        local_a8._56_8_ = 0;
        set_fill_set((lyxp_set *)auStack_f8,set);
        iVar6 = eval_expr_select(local_48,exp_idx,LYXP_EXPR_EQUALITY,local_38,param_5,set,options);
        plVar13 = local_38;
        if (iVar6 == 0) {
          local_b0 = "parsed";
          if (set == (lyxp_set *)0x0) {
            local_b0 = "skipped";
          }
          iVar6 = 0;
          do {
            plVar20 = local_48;
            local_60 = (char *)CONCAT44(local_60._4_4_,iVar6);
            uVar23 = *exp_idx;
            if (local_48->tokens[uVar23] != LYXP_TOKEN_OPERATOR_COMP) {
              __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_COMP",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                            ,0x1fd0,
                            "int eval_equality_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                           );
            }
            ly_log_dbg(8,"%-27s %s %s[%u]","eval_equality_expr",local_b0,"Operator(Comparison)");
            *exp_idx = *exp_idx + 1;
            if (local_50 == (lyxp_set *)0x0) {
              iVar6 = eval_expr_select(plVar20,exp_idx,LYXP_EXPR_EQUALITY,local_38,local_40,
                                       (lyxp_set *)0x0,options);
              if (iVar6 != 0) {
                return iVar6;
              }
            }
            else {
              set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
              plVar13 = local_38;
              iVar6 = eval_expr_select(plVar20,exp_idx,LYXP_EXPR_EQUALITY,local_38,local_40,
                                       &local_a8,options);
              plVar5 = local_40;
              plVar20 = local_48;
              plVar15 = local_50;
              uVar3 = local_a8.val.nodes;
              param_5 = local_40;
              if (iVar6 != 0) goto LAB_00174f7a;
              if ((options & 0x1cU) == 0) {
                if (((local_50->type == LYXP_SET_NODE_SET) &&
                    (plVar8 = ((local_50->val).nodes)->node->schema,
                    (plVar8->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)) &&
                   ((*(int *)&plVar8[1].ref == 7 &&
                    ((local_a8.type == LYXP_SET_STRING &&
                     (pcVar9 = strchr(local_a8.val.str,0x3a), pcVar9 == (char *)0x0)))))) {
                  sVar10 = strlen(local_40->name);
                  sVar11 = strlen((char *)uVar3);
                  __s = (lyxp_set_node *)ly_realloc((void *)uVar3,sVar10 + sVar11 + 2);
                  local_a8.val.str = (char *)__s;
                  if (__s == (lyxp_set_node *)0x0) break;
                  sVar10 = strlen(local_40->name);
                  sVar11 = strlen((char *)__s);
                  memmove((char *)((long)&__s->node + sVar10 + 1),__s,sVar11 + 1);
                  plVar5 = local_40;
                  uVar3 = local_a8.val.str;
                  pcVar9 = local_40->name;
                  sVar10 = strlen(pcVar9);
                  memcpy((void *)uVar3,pcVar9,sVar10);
                  uVar3 = local_a8.val.str;
                  sVar10 = strlen(plVar5->name);
                  *(char *)((long)&((lyxp_set_node *)uVar3)->node + sVar10) = ':';
                }
                iVar6 = moveto_op_comp(local_50,&local_a8,
                                       local_48->expr + local_48->expr_pos[uVar23],local_38,local_40
                                       ,options);
                if (iVar6 != 0) {
                  iVar6 = -1;
                  param_5 = local_40;
                  plVar13 = local_38;
                  goto LAB_00174f7a;
                }
              }
              else {
                uVar19 = uVar23 - 1;
                warn_operands(local_40->ctx,local_50,&local_a8,0,local_48->expr,
                              local_48->expr_pos[(ulong)uVar23 - 1]);
                warn_equality_value(plVar5->ctx,plVar20,plVar15,*local_58 - 1,uVar19,*local_58 - 1);
                exp_idx = local_58;
                warn_equality_value(plVar5->ctx,plVar20,&local_a8,uVar19,uVar19,*local_58 - 1);
                set_snode_merge(plVar15,&local_a8);
                uVar1 = plVar15->used;
                if ((ulong)uVar1 != 0) {
                  lVar16 = 0;
                  do {
                    if (*(int *)((long)&((plVar15->val).nodes)->pos + lVar16) == 1) {
                      *(undefined4 *)((long)&((plVar15->val).nodes)->pos + lVar16) = 0;
                    }
                    lVar16 = lVar16 + 0x10;
                  } while ((ulong)uVar1 << 4 != lVar16);
                }
              }
            }
            iVar6 = (int)local_60 + 1;
          } while ((ushort)iVar6 != uVar22);
          iVar6 = 0;
          param_5 = local_40;
          plVar13 = local_38;
        }
        break;
      case LYXP_EXPR_RELATIONAL:
        if (uVar22 == 0) {
          __assert_fail("repeat",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1f73,
                        "int eval_relational_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        uStack_c0 = 0;
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        phStack_d0 = (hash_table *)0x0;
        local_e8.nodes = (lyxp_set_node *)0x0;
        local_e8._8_8_ = 0;
        auStack_f8 = (undefined1  [8])0x0;
        _root_type = 0;
        local_a8.type = LYXP_SET_EMPTY;
        local_a8._4_4_ = 0;
        local_a8._8_8_ = 0;
        local_a8.val.nodes = (lyxp_set_node *)0x0;
        local_a8.val._8_8_ = 0;
        local_a8.used = 0;
        local_a8.size = 0;
        local_a8.ht = (hash_table *)0x0;
        local_a8.ctx_pos = 0;
        local_a8.ctx_size = 0;
        local_a8._56_8_ = 0;
        set_fill_set((lyxp_set *)auStack_f8,set);
        plVar13 = local_38;
        iVar6 = eval_expr_select(local_48,exp_idx,LYXP_EXPR_RELATIONAL,local_38,param_5,set,options)
        ;
        puVar17 = local_58;
        if (iVar6 == 0) {
          local_b0 = "parsed";
          if (set == (lyxp_set *)0x0) {
            local_b0 = "skipped";
          }
          iVar6 = 0;
          do {
            plVar20 = local_48;
            local_60 = (char *)CONCAT44(local_60._4_4_,iVar6);
            uVar24 = (ulong)*puVar17;
            if (local_48->tokens[uVar24] != LYXP_TOKEN_OPERATOR_COMP) {
              __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_COMP",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                            ,0x1f83,
                            "int eval_relational_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                           );
            }
            ly_log_dbg(8,"%-27s %s %s[%u]","eval_relational_expr",local_b0,"Operator(Comparison)");
            param_5 = local_40;
            *puVar17 = *puVar17 + 1;
            if (local_50 == (lyxp_set *)0x0) {
              iVar6 = eval_expr_select(plVar20,puVar17,LYXP_EXPR_RELATIONAL,local_38,local_40,
                                       (lyxp_set *)0x0,options);
              plVar13 = local_38;
              if (iVar6 != 0) goto LAB_00174f7a;
            }
            else {
              set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
              iVar6 = eval_expr_select(plVar20,puVar17,LYXP_EXPR_RELATIONAL,local_38,local_40,
                                       &local_a8,options);
              param_5 = local_40;
              plVar15 = local_50;
              plVar13 = local_38;
              if (iVar6 != 0) goto LAB_00174f7a;
              if ((options & 0x1cU) == 0) {
                iVar6 = moveto_op_comp(local_50,&local_a8,
                                       local_48->expr + local_48->expr_pos[uVar24],local_38,local_40
                                       ,options);
                if (iVar6 != 0) goto LAB_00174fb8;
              }
              else {
                warn_operands(local_40->ctx,local_50,&local_a8,1,local_48->expr,
                              local_48->expr_pos[uVar24 - 1]);
                set_snode_merge(plVar15,&local_a8);
                uVar1 = plVar15->used;
                if ((ulong)uVar1 != 0) {
                  lVar16 = 0;
                  do {
                    if (*(int *)((long)&((plVar15->val).nodes)->pos + lVar16) == 1) {
                      *(undefined4 *)((long)&((plVar15->val).nodes)->pos + lVar16) = 0;
                    }
                    lVar16 = lVar16 + 0x10;
                  } while ((ulong)uVar1 << 4 != lVar16);
                }
              }
            }
            iVar6 = (int)local_60 + 1;
          } while ((ushort)iVar6 != uVar22);
          goto LAB_00174f6a;
        }
        break;
      case LYXP_EXPR_ADDITIVE:
        if (uVar22 == 0) {
          __assert_fail("repeat",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1f24,
                        "int eval_additive_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        uStack_c0 = 0;
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        phStack_d0 = (hash_table *)0x0;
        local_e8.nodes = (lyxp_set_node *)0x0;
        local_e8._8_8_ = 0;
        auStack_f8 = (undefined1  [8])0x0;
        _root_type = 0;
        local_a8.type = LYXP_SET_EMPTY;
        local_a8._4_4_ = 0;
        local_a8._8_8_ = 0;
        local_a8.val.nodes = (lyxp_set_node *)0x0;
        local_a8.val._8_8_ = 0;
        local_a8.used = 0;
        local_a8.size = 0;
        local_a8.ht = (hash_table *)0x0;
        local_a8.ctx_pos = 0;
        local_a8.ctx_size = 0;
        local_a8._56_8_ = 0;
        set_fill_set((lyxp_set *)auStack_f8,set);
        plVar20 = local_48;
        puVar17 = local_58;
        iVar6 = eval_expr_select(local_48,local_58,LYXP_EXPR_ADDITIVE,local_38,local_40,set,options)
        ;
        if (iVar6 == 0) {
          local_b0 = "parsed";
          if (set == (lyxp_set *)0x0) {
            local_b0 = "skipped";
          }
          uVar24 = (ulong)*puVar17;
          if (plVar20->tokens[uVar24] == LYXP_TOKEN_OPERATOR_MATH) {
            local_60 = (char *)((ulong)local_60 & 0xffffffff00000000);
            do {
              ly_log_dbg(8,"%-27s %s %s[%u]","eval_additive_expr",local_b0,"Operator(Math)");
              *puVar17 = *puVar17 + 1;
              if (local_50 == (lyxp_set *)0x0) {
                iVar6 = eval_expr_select(plVar20,puVar17,LYXP_EXPR_ADDITIVE,local_38,local_40,
                                         (lyxp_set *)0x0,options);
                if (iVar6 != 0) goto LAB_00174234;
LAB_001746fd:
                iVar7 = (int)local_60 + 1;
                if (uVar22 <= (ushort)iVar7) {
                  iVar6 = 0;
                  goto LAB_00174234;
                }
              }
              else {
                set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
                iVar6 = eval_expr_select(plVar20,puVar17,LYXP_EXPR_ADDITIVE,local_38,local_40,
                                         &local_a8,options);
                plVar15 = local_50;
                if (iVar6 != 0) goto LAB_00174234;
                if ((options & 0x1cU) != 0) {
                  warn_operands(local_40->ctx,local_50,&local_a8,1,local_48->expr,
                                local_48->expr_pos[uVar24 - 1]);
                  set_snode_merge(plVar15,&local_a8);
                  uVar1 = plVar15->used;
                  if ((ulong)uVar1 != 0) {
                    lVar16 = 0;
                    do {
                      if (*(int *)((long)&((plVar15->val).nodes)->pos + lVar16) == 1) {
                        *(undefined4 *)((long)&((plVar15->val).nodes)->pos + lVar16) = 0;
                      }
                      lVar16 = lVar16 + 0x10;
                    } while ((ulong)uVar1 << 4 != lVar16);
                  }
                  goto LAB_001746fd;
                }
                iVar7 = moveto_op_math(local_50,&local_a8,
                                       local_48->expr + local_48->expr_pos[uVar24],local_38,local_40
                                       ,options);
                iVar6 = 0;
                if (iVar7 != 0) goto LAB_00174234;
                iVar7 = (int)local_60 + 1;
                if (uVar22 <= (ushort)iVar7) goto LAB_00174234;
              }
              local_60 = (char *)CONCAT44(local_60._4_4_,iVar7);
              uVar24 = (ulong)*puVar17;
              plVar20 = local_48;
            } while (local_48->tokens[uVar24] == LYXP_TOKEN_OPERATOR_MATH);
          }
          __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_MATH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1f34,
                        "int eval_additive_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
LAB_00174234:
        plVar13 = local_38;
        param_5 = local_40;
        lyxp_set_cast((lyxp_set *)auStack_f8,LYXP_SET_EMPTY,local_38,local_40,options);
        goto LAB_00174f9b;
      case LYXP_EXPR_MULTIPLICATIVE:
        if (uVar22 == 0) {
          __assert_fail("repeat",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1ed6,
                        "int eval_multiplicative_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        uStack_c0 = 0;
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        phStack_d0 = (hash_table *)0x0;
        local_e8.nodes = (lyxp_set_node *)0x0;
        local_e8._8_8_ = 0;
        auStack_f8 = (undefined1  [8])0x0;
        _root_type = 0;
        local_a8.type = LYXP_SET_EMPTY;
        local_a8._4_4_ = 0;
        local_a8._8_8_ = 0;
        local_a8.val.nodes = (lyxp_set_node *)0x0;
        local_a8.val._8_8_ = 0;
        local_a8.used = 0;
        local_a8.size = 0;
        local_a8.ht = (hash_table *)0x0;
        local_a8.ctx_pos = 0;
        local_a8.ctx_size = 0;
        local_a8._56_8_ = 0;
        set_fill_set((lyxp_set *)auStack_f8,set);
        plVar13 = local_38;
        iVar6 = eval_expr_select(local_48,exp_idx,LYXP_EXPR_MULTIPLICATIVE,local_38,param_5,set,
                                 options);
        puVar17 = local_58;
        if (iVar6 == 0) {
          local_b0 = "parsed";
          if (set == (lyxp_set *)0x0) {
            local_b0 = "skipped";
          }
          iVar6 = 0;
          do {
            plVar20 = local_48;
            local_60 = (char *)CONCAT44(local_60._4_4_,iVar6);
            uVar24 = (ulong)*puVar17;
            if (local_48->tokens[uVar24] != LYXP_TOKEN_OPERATOR_MATH) {
              __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_MATH",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                            ,0x1ee6,
                            "int eval_multiplicative_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                           );
            }
            ly_log_dbg(8,"%-27s %s %s[%u]","eval_multiplicative_expr",local_b0,"Operator(Math)");
            param_5 = local_40;
            *puVar17 = *puVar17 + 1;
            if (local_50 == (lyxp_set *)0x0) {
              iVar6 = eval_expr_select(plVar20,puVar17,LYXP_EXPR_MULTIPLICATIVE,local_38,local_40,
                                       (lyxp_set *)0x0,options);
              plVar13 = local_38;
              if (iVar6 != 0) goto LAB_00174f7a;
            }
            else {
              set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
              iVar6 = eval_expr_select(plVar20,puVar17,LYXP_EXPR_MULTIPLICATIVE,local_38,local_40,
                                       &local_a8,options);
              param_5 = local_40;
              plVar15 = local_50;
              plVar13 = local_38;
              if (iVar6 != 0) goto LAB_00174f7a;
              if ((options & 0x1cU) == 0) {
                iVar6 = moveto_op_math(local_50,&local_a8,
                                       local_48->expr + local_48->expr_pos[uVar24],local_38,local_40
                                       ,options);
                if (iVar6 != 0) goto LAB_00174fb8;
              }
              else {
                warn_operands(local_40->ctx,local_50,&local_a8,1,local_48->expr,
                              local_48->expr_pos[uVar24 - 1]);
                set_snode_merge(plVar15,&local_a8);
                uVar1 = plVar15->used;
                if ((ulong)uVar1 != 0) {
                  lVar16 = 0;
                  do {
                    if (*(int *)((long)&((plVar15->val).nodes)->pos + lVar16) == 1) {
                      *(undefined4 *)((long)&((plVar15->val).nodes)->pos + lVar16) = 0;
                    }
                    lVar16 = lVar16 + 0x10;
                  } while ((ulong)uVar1 << 4 != lVar16);
                }
              }
            }
            iVar6 = (int)local_60 + 1;
          } while ((ushort)iVar6 != uVar22);
          goto LAB_00174f6a;
        }
        break;
      case LYXP_EXPR_UNARY:
        if (uVar22 == 0) {
          __assert_fail("repeat",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1e9f,
                        "int eval_unary_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        pcVar9 = "parsed";
        uVar12 = uVar24;
        uVar23 = uVar22;
        if (set == (lyxp_set *)0x0) {
          pcVar9 = "skipped";
        }
        do {
          if (((local_48->used == (uint16_t)uVar12) ||
              (local_48->tokens[uVar12 & 0xffff] != LYXP_TOKEN_OPERATOR_MATH)) ||
             (local_48->expr[local_48->expr_pos[uVar12 & 0xffff]] != '-')) {
            __assert_fail("!exp_check_token(local_mod->ctx, exp, *exp_idx, LYXP_TOKEN_OPERATOR_MATH, 0) && (exp->expr[exp->expr_pos[*exp_idx]] == \'-\')"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                          ,0x1ea4,
                          "int eval_unary_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                         );
          }
          ly_log_dbg(8,"%-27s %s %s[%u]","eval_unary_expr",pcVar9,"Operator(Math)");
          plVar5 = local_40;
          plVar15 = local_50;
          uVar21 = *local_58;
          *local_58 = (uint16_t)(uVar21 + 1);
          uVar23 = uVar23 - 1;
          uVar12 = (ulong)(uVar21 + 1);
        } while (uVar23 != 0);
        iVar6 = eval_expr_select(local_48,local_58,LYXP_EXPR_UNARY,local_38,local_40,local_50,
                                 options);
        if (iVar6 != 0) {
          return iVar6;
        }
        if ((uVar22 & 1) == 0 || plVar15 == (lyxp_set *)0x0) {
          return 0;
        }
        if ((options & 0x1cU) != 0) {
          warn_operands(plVar5->ctx,local_50,(lyxp_set *)0x0,1,local_48->expr,
                        local_48->expr_pos[uVar24]);
          return 0;
        }
        iVar6 = moveto_op_math(local_50,(lyxp_set *)0x0,local_48->expr + local_48->expr_pos[uVar24],
                               local_38,plVar5,options);
        if (iVar6 == 0) {
          return 0;
        }
        return -1;
      case LYXP_EXPR_UNION:
        if (uVar22 == 0) {
          __assert_fail("repeat",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1e5b,
                        "int eval_union_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        uStack_c0 = 0;
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        phStack_d0 = (hash_table *)0x0;
        local_e8.nodes = (lyxp_set_node *)0x0;
        local_e8._8_8_ = 0;
        auStack_f8 = (undefined1  [8])0x0;
        _root_type = 0;
        local_a8.type = LYXP_SET_EMPTY;
        local_a8._4_4_ = 0;
        local_a8._8_8_ = 0;
        local_a8.val.nodes = (lyxp_set_node *)0x0;
        local_a8.val._8_8_ = 0;
        local_a8.used = 0;
        local_a8.size = 0;
        local_a8.ht = (hash_table *)0x0;
        local_a8.ctx_pos = 0;
        local_a8.ctx_size = 0;
        local_a8._56_8_ = 0;
        set_fill_set((lyxp_set *)auStack_f8,set);
        iVar6 = eval_expr_select(local_48,exp_idx,LYXP_EXPR_UNION,local_38,param_5,set,options);
        plVar13 = local_38;
        if (iVar6 == 0) {
          local_60 = "parsed";
          if (set == (lyxp_set *)0x0) {
            local_60 = "skipped";
          }
          do {
            plVar20 = local_48;
            if (local_48->tokens[*exp_idx] != LYXP_TOKEN_OPERATOR_UNI) {
              __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_UNI",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                            ,0x1e69,
                            "int eval_union_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                           );
            }
            ly_log_dbg(8,"%-27s %s %s[%u]","eval_union_expr",local_60,"Operator(Union)");
            *exp_idx = *exp_idx + 1;
            if (local_50 == (lyxp_set *)0x0) {
              iVar6 = eval_expr_select(plVar20,exp_idx,LYXP_EXPR_UNION,local_38,param_5,
                                       (lyxp_set *)0x0,options);
              plVar13 = local_38;
              if (iVar6 != 0) goto LAB_00174f7a;
            }
            else {
              set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
              iVar6 = eval_expr_select(plVar20,exp_idx,LYXP_EXPR_UNION,local_38,param_5,&local_a8,
                                       options);
              plVar13 = local_38;
              if (iVar6 != 0) goto LAB_00174f7a;
              if ((options & 0x1cU) == 0) {
                iVar6 = moveto_union(local_50,&local_a8,local_38,options);
                if (iVar6 != 0) {
                  iVar6 = -1;
                  plVar13 = local_38;
                  goto LAB_00174f7a;
                }
              }
              else {
                set_snode_merge(local_50,&local_a8);
              }
            }
            uVar22 = uVar22 - 1;
          } while (uVar22 != 0);
          iVar6 = 0;
          plVar13 = local_38;
        }
        break;
      default:
        if (param_5 == (lys_module *)0x0) {
          plVar18 = (ly_ctx *)0x0;
        }
        else {
          plVar18 = param_5->ctx;
        }
        ly_log(plVar18,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
               ,0x20eb);
        return -1;
      }
LAB_00174f7a:
      lyxp_set_cast((lyxp_set *)auStack_f8,LYXP_SET_EMPTY,plVar13,param_5,options);
LAB_00174f9b:
      lyxp_set_cast(&local_a8,LYXP_SET_EMPTY,plVar13,param_5,options);
      return iVar6;
    }
  }
switchD_0017376e_caseD_0:
  switch(exp->tokens[uVar24]) {
  case LYXP_TOKEN_PAR1:
    pcVar9 = "parsed";
    if (set == (lyxp_set *)0x0) {
      pcVar9 = "skipped";
    }
    ly_log_dbg(8,"%-27s %s %s[%u]","eval_path_expr",pcVar9,"(",(ulong)exp->expr_pos[uVar24]);
    *exp_idx = *exp_idx + 1;
    iVar6 = eval_expr_select(exp,exp_idx,LYXP_EXPR_NONE,local_38,param_5,set,options);
    if (iVar6 == -1) {
      return -1;
    }
    if (iVar6 == 1) {
      return 1;
    }
    if (local_48->tokens[*exp_idx] != LYXP_TOKEN_PAR2) {
      __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_PAR2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x1dd4,
                    "int eval_path_expr(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                   );
    }
    iVar6 = 0;
    ly_log_dbg(8,"%-27s %s %s[%u]","eval_path_expr",pcVar9,")",(ulong)local_48->expr_pos[*exp_idx]);
    *exp_idx = *exp_idx + 1;
    puVar17 = local_58;
    exp = local_48;
    cur_node = local_38;
    break;
  default:
    plVar18 = param_5->ctx;
    pcVar9 = print_token(exp->tokens[uVar24]);
    ly_vlog(plVar18,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar9,
            exp->expr + exp->expr_pos[*exp_idx]);
    return -1;
  case LYXP_TOKEN_DOT:
  case LYXP_TOKEN_DDOT:
  case LYXP_TOKEN_AT:
  case LYXP_TOKEN_NAMETEST:
  case LYXP_TOKEN_NODETYPE:
    goto LAB_001737a4;
  case LYXP_TOKEN_FUNCNAME:
    plVar15 = set;
    if (set == (lyxp_set *)0x0) {
      plVar15 = (lyxp_set *)0x0;
    }
    iVar6 = eval_function_call(exp,exp_idx,cur_node,param_5,plVar15,options);
    if (iVar6 != 0) {
      return iVar6;
    }
LAB_00174436:
    iVar6 = 1;
    puVar17 = local_58;
    exp = local_48;
    break;
  case LYXP_TOKEN_OPERATOR_PATH:
    if (set == (lyxp_set *)0x0) {
      pcVar9 = "skipped";
    }
    else {
      if ((options & 0x1cU) == 0) {
        plVar13 = moveto_get_root(cur_node,options,(lyxp_node_type *)auStack_f8);
        lyxp_set_cast(set,LYXP_SET_EMPTY,cur_node,(lys_module *)0x0,options);
        if (plVar13 != (lyd_node *)0x0) {
          set_insert_node(set,plVar13,0,auStack_f8._0_4_,0);
        }
      }
      else if (cur_node == (lyd_node *)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
               ,0x14af);
      }
      else {
        plVar8 = moveto_snode_get_root((lys_node *)cur_node,options,(lyxp_node_type *)auStack_f8);
        uVar1 = local_50->used;
        if ((ulong)uVar1 != 0) {
          lVar16 = 0;
          do {
            if (*(int *)((long)&((local_50->val).nodes)->pos + lVar16) == 1) {
              *(undefined4 *)((long)&((local_50->val).nodes)->pos + lVar16) = 0;
            }
            lVar16 = lVar16 + 0x10;
          } while ((ulong)uVar1 << 4 != lVar16);
        }
        set_snode_insert_node(local_50,plVar8,auStack_f8._0_4_);
      }
      pcVar9 = "parsed";
    }
    exp = local_48;
    uVar19 = local_48->tok_len[*exp_idx];
    pcVar14 = print_token(local_48->tokens[*exp_idx]);
    ly_log_dbg(8,"%-27s %s %s[%u]","eval_absolute_location_path",pcVar9,pcVar14,
               (ulong)exp->expr_pos[*exp_idx]);
    uVar23 = *exp_idx + 1;
    *exp_idx = uVar23;
    if (uVar19 != 1) {
      iVar6 = 1;
      plVar15 = local_50;
      goto LAB_001737a7;
    }
    if (exp->used == uVar23) {
      return 0;
    }
    if (LYXP_TOKEN_NODETYPE < exp->tokens[uVar23]) {
      return 0;
    }
    if ((0x6e0U >> (exp->tokens[uVar23] & (LYXP_TOKEN_OPERATOR_PATH|LYXP_TOKEN_OPERATOR_UNI)) & 1)
        == 0) {
      return 0;
    }
LAB_001737a4:
    iVar6 = 0;
    plVar15 = local_50;
    goto LAB_001737a7;
  case LYXP_TOKEN_LITERAL:
    if (set == (lyxp_set *)0x0 || (options & 0x1cU) != 0) {
      if ((set != (lyxp_set *)0x0) && (uVar1 = set->used, (ulong)uVar1 != 0)) {
        lVar16 = 0;
        do {
          if (*(int *)((long)&((set->val).nodes)->pos + lVar16) == 1) {
            *(undefined4 *)((long)&((set->val).nodes)->pos + lVar16) = 0;
          }
          lVar16 = lVar16 + 0x10;
        } while ((ulong)uVar1 << 4 != lVar16);
      }
      eval_literal(exp,exp_idx,(lyxp_set *)0x0);
      goto LAB_00174436;
    }
    eval_literal(exp,exp_idx,set);
    iVar6 = 1;
    puVar17 = local_58;
    exp = local_48;
    cur_node = local_38;
    break;
  case LYXP_TOKEN_NUMBER:
    if (set == (lyxp_set *)0x0 || (options & 0x1cU) != 0) {
      if ((set != (lyxp_set *)0x0) && (uVar1 = set->used, (ulong)uVar1 != 0)) {
        lVar16 = 0;
        do {
          if (*(int *)((long)&((set->val).nodes)->pos + lVar16) == 1) {
            *(undefined4 *)((long)&((set->val).nodes)->pos + lVar16) = 0;
          }
          lVar16 = lVar16 + 0x10;
        } while ((ulong)uVar1 << 4 != lVar16);
      }
      plVar18 = param_5->ctx;
      plVar15 = (lyxp_set *)0x0;
    }
    else {
      plVar18 = param_5->ctx;
      plVar15 = set;
    }
    iVar6 = eval_number(plVar18,exp,exp_idx,plVar15);
    if (iVar6 != 0) {
      return -1;
    }
    iVar6 = 1;
    puVar17 = local_58;
    exp = local_48;
  }
  while( true ) {
    plVar15 = local_50;
    puVar4 = local_58;
    uVar23 = *puVar17;
    if (exp->used <= uVar23) {
      return 0;
    }
    if (exp->tokens[uVar23] != LYXP_TOKEN_BRACK1) break;
    iVar7 = eval_predicate(exp,local_58,cur_node,local_40,local_50,options,iVar6);
    puVar17 = puVar4;
    if (iVar7 != 0) {
      return iVar7;
    }
  }
  if (exp->tokens[uVar23] != LYXP_TOKEN_OPERATOR_PATH) {
    return 0;
  }
  iVar6 = 0;
  if (exp->tok_len[uVar23] != 1) {
    if (exp->tok_len[uVar23] != 2) {
      __assert_fail("exp->tok_len[*exp_idx] == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x1e35,
                    "int eval_path_expr(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                   );
    }
    iVar6 = 1;
  }
  pcVar9 = "parsed";
  if (local_50 == (lyxp_set *)0x0) {
    pcVar9 = "skipped";
  }
  ly_log_dbg(8,"%-27s %s %s[%u]","eval_path_expr",pcVar9,"Operator(Path)",
             (ulong)exp->expr_pos[uVar23]);
  *local_58 = *local_58 + 1;
  exp_idx = local_58;
LAB_001737a7:
  iVar6 = eval_relative_location_path(exp,exp_idx,cur_node,local_40,iVar6,plVar15,options);
  if (iVar6 == 0) {
    return 0;
  }
  return iVar6;
LAB_00174fb8:
  iVar6 = -1;
  plVar13 = local_38;
  goto LAB_00174f7a;
}

Assistant:

static int
eval_expr_select(struct lyxp_expr *exp, uint16_t *exp_idx, enum lyxp_expr_type etype, struct lyd_node *cur_node,
                 struct lys_module *local_mod, struct lyxp_set *set, int options)
{
    int ret;
    uint16_t i, count;
    enum lyxp_expr_type next_etype;

    /* process operator repeats */
    if (!exp->repeat[*exp_idx]) {
        next_etype = LYXP_EXPR_NONE;
    } else {
        /* find etype repeat */
        for (i = 0; exp->repeat[*exp_idx][i] > etype; ++i);

        /* select one-priority lower because etype expression called us */
        if (i) {
            next_etype = exp->repeat[*exp_idx][i - 1];
            /* count repeats for that expression */
            for (count = 0; i && exp->repeat[*exp_idx][i - 1] == next_etype; ++count, --i);
        } else {
            next_etype = LYXP_EXPR_NONE;
        }
    }

    /* decide what expression are we parsing based on the repeat */
    switch (next_etype) {
    case LYXP_EXPR_OR:
        ret = eval_or_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_AND:
        ret = eval_and_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_EQUALITY:
        ret = eval_equality_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_RELATIONAL:
        ret = eval_relational_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_ADDITIVE:
        ret = eval_additive_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_MULTIPLICATIVE:
        ret = eval_multiplicative_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_UNARY:
        ret = eval_unary_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_UNION:
        ret = eval_union_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_NONE:
        ret = eval_path_expr(exp, exp_idx, cur_node, local_mod, set, options);
        break;
    default:
        ret = -1;
        LOGINT(local_mod ? local_mod->ctx : NULL);
        break;
    }

    return ret;
}